

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O2

void InitZopfliCostModel(MemoryManager *m,ZopfliCostModel *self,BrotliDistanceParams *dist,
                        size_t num_bytes)

{
  float *pfVar1;
  uint32_t uVar2;
  
  self->num_bytes_ = num_bytes;
  uVar2 = 0;
  if (num_bytes + 2 == 0) {
    pfVar1 = (float *)0x0;
  }
  else {
    pfVar1 = (float *)duckdb_brotli::BrotliAllocate(m,(num_bytes + 2) * 4);
  }
  self->literal_costs_ = pfVar1;
  if ((ulong)dist->alphabet_size_limit == 0) {
    pfVar1 = (float *)0x0;
  }
  else {
    pfVar1 = (float *)duckdb_brotli::BrotliAllocate(m,(ulong)dist->alphabet_size_limit << 2);
    uVar2 = dist->alphabet_size_limit;
  }
  self->cost_dist_ = pfVar1;
  self->distance_histogram_size = uVar2;
  return;
}

Assistant:

static void InitZopfliCostModel(
    MemoryManager* m, ZopfliCostModel* self, const BrotliDistanceParams* dist,
    size_t num_bytes) {
  self->num_bytes_ = num_bytes;
  self->literal_costs_ = BROTLI_ALLOC(m, float, num_bytes + 2);
  self->cost_dist_ = BROTLI_ALLOC(m, float, dist->alphabet_size_limit);
  self->distance_histogram_size = dist->alphabet_size_limit;
  if (BROTLI_IS_OOM(m)) return;
}